

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

void __thiscall
backward::Printer::print_stacktrace<backward::StackTrace>
          (Printer *this,StackTrace *st,ostream *os,Colorize *colorize)

{
  ResolvedTrace *in_RDX;
  StackTraceImplBase *in_RSI;
  ResolvedTrace *in_RDI;
  Trace TVar1;
  size_t trace_idx;
  ostream *in_stack_fffffffffffffe28;
  Printer *in_stack_fffffffffffffe30;
  ResolvedTrace *this_00;
  StackTrace *in_stack_fffffffffffffe38;
  StackTraceImplHolder *in_stack_fffffffffffffe40;
  ResolvedTrace *mini_trace;
  Colorize *in_stack_fffffffffffffe58;
  ResolvedTrace *in_stack_fffffffffffffe60;
  ResolvedTrace *in_stack_fffffffffffffe80;
  TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol> *in_stack_fffffffffffffe88;
  undefined8 local_28;
  
  mini_trace = in_RDX;
  StackTraceImplBase::thread_id(in_RSI);
  print_header(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,0x114240);
  TraceResolverImplBase::load_stacktrace<backward::StackTrace>
            ((TraceResolverImplBase *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  for (local_28 = StackTraceImplHolder::size(in_stack_fffffffffffffe40); local_28 != 0;
      local_28 = local_28 - 1) {
    this_00 = in_RDX;
    TVar1 = StackTraceImplHolder::operator[]((StackTraceImplHolder *)in_RDI,(size_t)mini_trace);
    ResolvedTrace::ResolvedTrace(in_RDI,&mini_trace->super_Trace);
    TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>::resolve
              (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    print_trace((Printer *)TVar1.idx,(ostream *)TVar1.addr,in_stack_fffffffffffffe60,
                in_stack_fffffffffffffe58);
    ResolvedTrace::~ResolvedTrace(this_00);
    ResolvedTrace::~ResolvedTrace(this_00);
  }
  return;
}

Assistant:

void print_stacktrace(ST &st, std::ostream &os, Colorize &colorize) {
    print_header(os, st.thread_id());
    _resolver.load_stacktrace(st);
    for (size_t trace_idx = st.size(); trace_idx > 0; --trace_idx) {
      print_trace(os, _resolver.resolve(st[trace_idx - 1]), colorize);
    }
  }